

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O2

bool __thiscall basisu::basis_compressor::create_ktx2_file(basis_compressor *this)

{
  basisu_backend_slice_desc_vec *this_00;
  uint8_vec *this_01;
  basis_texture_type bVar1;
  vector<basisu::vector<unsigned_char>_> *vec;
  basis_compressor *pbVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  basisu_backend_slice_desc *pbVar6;
  vector<unsigned_char> *pvVar7;
  uint *puVar8;
  vector<unsigned_char> *other_vec;
  ktx2_etc1s_image_desc *pkVar9;
  key_value *pkVar10;
  size_t sVar11;
  uchar *puVar12;
  ktx2_level_index *pkVar13;
  uint uVar14;
  int iVar15;
  size_t new_size_size_t;
  uint uVar16;
  uint64_t uVar17;
  basis_compressor *this_02;
  ulong i_00;
  uint32_t i;
  ulong uVar18;
  long lVar19;
  uint32_t slice_index;
  uint32_t uVar20;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  long lStack_1f0;
  uchar local_1e1;
  vector<basisu::vector<unsigned_char>_> *local_1e0;
  uint local_1d4;
  basis_compressor *local_1d0;
  key_value_vec key_values;
  vector<basist::ktx2_level_index> level_index_array;
  uint8_vec etc1s_global_data;
  uint8_vec key_value_data;
  uint8_vec dfd;
  vector<basisu::vector<unsigned_char>_> level_data_bytes;
  uint_vec slice_level_offsets;
  vector<basisu::vector<unsigned_char>_> compressed_level_data_bytes;
  ktx2_header local_120;
  vector<unsigned_char> *local_d0;
  vector<unsigned_char> *local_c8;
  vector<unsigned_char> *local_c0;
  char writer_id [128];
  
  if (((this->m_params).m_uastc.m_value == true) &&
     (((this->m_params).m_ktx2_uastc_supercompression & ~KTX2_SS_ZSTANDARD) != KTX2_SS_NONE)) {
    bVar22 = false;
  }
  else {
    this_00 = &this->m_slice_descs;
    uVar5 = 0;
    uVar16 = 0;
    local_1e0 = (vector<basisu::vector<unsigned_char>_> *)((ulong)local_1e0 & 0xffffffff00000000);
    uVar20 = 0;
    for (uVar18 = 0; uVar18 < (this->m_slice_descs).m_size; uVar18 = uVar18 + 1) {
      pbVar6 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,uVar18);
      if (pbVar6->m_mip_index == 0 && uVar20 == 0) {
        pbVar6 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,uVar18);
        uVar20 = pbVar6->m_orig_width;
        pbVar6 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,uVar18);
        local_1e0 = (vector<basisu::vector<unsigned_char>_> *)
                    CONCAT44(local_1e0._4_4_,pbVar6->m_orig_height);
      }
      pbVar6 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,uVar18);
      uVar3 = pbVar6->m_source_file_index + 1;
      if (uVar16 <= uVar3) {
        uVar16 = uVar3;
      }
      pbVar6 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,uVar18);
      if (pbVar6->m_source_file_index == 0) {
        pbVar6 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,uVar18);
        uVar3 = pbVar6->m_mip_index + 1;
        if (uVar5 <= uVar3) {
          uVar5 = uVar3;
        }
      }
    }
    local_1d0 = this;
    if ((this->m_params).m_tex_type == cBASISTexTypeCubemapArray) {
      if (uVar16 % 6 != 0) {
        __assert_fail("(total_layers % 6) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                      ,0x716,"bool basisu::basis_compressor::create_ktx2_file()");
      }
      uVar3 = 6;
      bVar22 = uVar16 < 6;
      uVar16 = uVar16 / 6;
      if (bVar22) {
        __assert_fail("total_layers >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                      ,0x719,"bool basisu::basis_compressor::create_ktx2_file()");
      }
    }
    else {
      uVar3 = 1;
    }
    local_120.m_kvd_byte_length.m_bytes[0] = '\0';
    local_120.m_kvd_byte_length.m_bytes[1] = '\0';
    local_120.m_kvd_byte_length.m_bytes[2] = '\0';
    local_120.m_kvd_byte_length.m_bytes[3] = '\0';
    local_120.m_sgd_byte_offset.m_bytes[0] = '\0';
    local_120.m_sgd_byte_offset.m_bytes[1] = '\0';
    local_120.m_sgd_byte_offset.m_bytes[2] = '\0';
    local_120.m_sgd_byte_offset.m_bytes[3] = '\0';
    local_120.m_sgd_byte_offset.m_bytes[4] = '\0';
    local_120.m_sgd_byte_offset.m_bytes[5] = '\0';
    local_120.m_sgd_byte_offset.m_bytes[6] = '\0';
    local_120.m_sgd_byte_offset.m_bytes[7] = '\0';
    local_120.m_sgd_byte_length.m_bytes[0] = '\0';
    local_120.m_sgd_byte_length.m_bytes[1] = '\0';
    local_120.m_sgd_byte_length.m_bytes[2] = '\0';
    local_120.m_sgd_byte_length.m_bytes[3] = '\0';
    local_120.m_supercompression_scheme.m_bytes[0] = '\0';
    local_120.m_supercompression_scheme.m_bytes[1] = '\0';
    local_120.m_supercompression_scheme.m_bytes[2] = '\0';
    local_120.m_supercompression_scheme.m_bytes[3] = '\0';
    local_120.m_dfd_byte_offset.m_bytes[0] = '\0';
    local_120.m_dfd_byte_offset.m_bytes[1] = '\0';
    local_120.m_dfd_byte_offset.m_bytes[2] = '\0';
    local_120.m_dfd_byte_offset.m_bytes[3] = '\0';
    local_120.m_dfd_byte_length.m_bytes[0] = '\0';
    local_120.m_dfd_byte_length.m_bytes[1] = '\0';
    local_120.m_dfd_byte_length.m_bytes[2] = '\0';
    local_120.m_dfd_byte_length.m_bytes[3] = '\0';
    local_120.m_kvd_byte_offset.m_bytes[0] = '\0';
    local_120.m_kvd_byte_offset.m_bytes[1] = '\0';
    local_120.m_kvd_byte_offset.m_bytes[2] = '\0';
    local_120.m_kvd_byte_offset.m_bytes[3] = '\0';
    local_120.m_sgd_byte_length.m_bytes[4] = '\0';
    local_120.m_sgd_byte_length.m_bytes[5] = '\0';
    local_120.m_sgd_byte_length.m_bytes[6] = '\0';
    local_120.m_sgd_byte_length.m_bytes[7] = '\0';
    local_120.m_pixel_depth.m_bytes[0] = '\0';
    local_120.m_pixel_depth.m_bytes[1] = '\0';
    local_120.m_pixel_depth.m_bytes[2] = '\0';
    local_120.m_pixel_depth.m_bytes[3] = '\0';
    local_120.m_layer_count.m_bytes[0] = '\0';
    local_120.m_layer_count.m_bytes[1] = '\0';
    local_120.m_layer_count.m_bytes[2] = '\0';
    local_120.m_layer_count.m_bytes[3] = '\0';
    local_120.m_face_count.m_bytes[0] = '\0';
    local_120.m_face_count.m_bytes[1] = '\0';
    local_120.m_face_count.m_bytes[2] = '\0';
    local_120.m_face_count.m_bytes[3] = '\0';
    local_120.m_level_count.m_bytes[0] = '\0';
    local_120.m_level_count.m_bytes[1] = '\0';
    local_120.m_level_count.m_bytes[2] = '\0';
    local_120.m_level_count.m_bytes[3] = '\0';
    local_120.m_vk_format.m_bytes[0] = '\0';
    local_120.m_vk_format.m_bytes[1] = '\0';
    local_120.m_vk_format.m_bytes[2] = '\0';
    local_120.m_vk_format.m_bytes[3] = '\0';
    local_120.m_type_size.m_bytes[0] = '\0';
    local_120.m_type_size.m_bytes[1] = '\0';
    local_120.m_type_size.m_bytes[2] = '\0';
    local_120.m_type_size.m_bytes[3] = '\0';
    local_120.m_pixel_width.m_bytes[0] = '\0';
    local_120.m_pixel_width.m_bytes[1] = '\0';
    local_120.m_pixel_width.m_bytes[2] = '\0';
    local_120.m_pixel_width.m_bytes[3] = '\0';
    local_120.m_pixel_height.m_bytes[0] = '\0';
    local_120.m_pixel_height.m_bytes[1] = '\0';
    local_120.m_pixel_height.m_bytes[2] = '\0';
    local_120.m_pixel_height.m_bytes[3] = '\0';
    local_120.m_identifier[0] = 0xab;
    local_120.m_identifier[1] = 'K';
    local_120.m_identifier[2] = 'T';
    local_120.m_identifier[3] = 'X';
    local_120.m_identifier[4] = ' ';
    local_120.m_identifier[5] = '2';
    local_120.m_identifier[6] = '0';
    local_120.m_identifier[7] = 0xbb;
    local_120.m_identifier[8] = '\r';
    local_120.m_identifier[9] = '\n';
    local_120.m_identifier[10] = '\x1a';
    local_120.m_identifier[0xb] = '\n';
    packed_uint<4U>::operator=(&local_120.m_pixel_width,(ulong)uVar20);
    packed_uint<4U>::operator=(&local_120.m_pixel_height,(ulong)local_1e0 & 0xffffffff);
    local_1d4 = uVar3;
    packed_uint<4U>::operator=(&local_120.m_face_count,(ulong)uVar3);
    uVar17 = 0;
    packed_uint<4U>::operator=(&local_120.m_vk_format,0);
    packed_uint<4U>::operator=(&local_120.m_type_size,1);
    uVar18 = (ulong)uVar5;
    packed_uint<4U>::operator=(&local_120.m_level_count,uVar18);
    if (1 < uVar16) {
      uVar17 = (uint64_t)uVar16;
    }
    packed_uint<4U>::operator=(&local_120.m_layer_count,uVar17);
    pbVar2 = local_1d0;
    if ((local_1d0->m_params).m_uastc.m_value == true) {
      if (((local_1d0->m_params).m_ktx2_uastc_supercompression & ~KTX2_SS_ZSTANDARD) != KTX2_SS_NONE
         ) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                      ,0x73c,"bool basisu::basis_compressor::create_ktx2_file()");
      }
      packed_uint<4U>::operator=(&local_120.m_supercompression_scheme,0);
    }
    vector<basisu::vector<unsigned_char>_>::vector(&level_data_bytes,uVar18);
    vector<basisu::vector<unsigned_char>_>::vector(&compressed_level_data_bytes,uVar18);
    vector<unsigned_int>::vector(&slice_level_offsets,(ulong)(pbVar2->m_slice_descs).m_size);
    this_02 = local_1d0;
    local_1e0 = &(pbVar2->m_backend).m_output.m_slice_image_data;
    for (uVar21 = 0; uVar21 < (this_02->m_slice_descs).m_size; uVar21 = uVar21 + 1) {
      pbVar6 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,uVar21);
      pvVar7 = vector<basisu::vector<unsigned_char>_>::operator[]
                         (&level_data_bytes,(ulong)pbVar6->m_mip_index);
      uVar20 = pvVar7->m_size;
      puVar8 = vector<unsigned_int>::operator[](&slice_level_offsets,uVar21);
      *puVar8 = uVar20;
      bVar22 = (this_02->m_params).m_uastc.m_value;
      pvVar7 = vector<basisu::vector<unsigned_char>_>::operator[]
                         (&level_data_bytes,(ulong)pbVar6->m_mip_index);
      if (bVar22 == true) {
        other_vec = vector<basisu::vector<unsigned_char>_>::operator[]
                              (&(pbVar2->m_uastc_backend_output).m_slice_image_data,uVar21);
      }
      else {
        other_vec = vector<basisu::vector<unsigned_char>_>::operator[](local_1e0,uVar21);
      }
      append_vector<basisu::vector<unsigned_char>>(pvVar7,other_vec);
    }
    if (((this_02->m_params).m_uastc.m_value == true) &&
       (local_120.m_supercompression_scheme.m_bytes == (uint8_t  [4])0x2)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                    ,0x764,"bool basisu::basis_compressor::create_ktx2_file()");
    }
    vector<basisu::vector<unsigned_char>_>::operator=
              (&compressed_level_data_bytes,&level_data_bytes);
    etc1s_global_data.m_p = (uchar *)0x0;
    etc1s_global_data.m_size = 0;
    etc1s_global_data.m_capacity = 0;
    if ((this_02->m_params).m_uastc.m_value == false) {
      writer_id[4] = '\0';
      writer_id[5] = '\0';
      writer_id[6] = '\0';
      writer_id[7] = '\0';
      writer_id[8] = '\0';
      writer_id[9] = '\0';
      writer_id[10] = '\0';
      writer_id[0xb] = '\0';
      writer_id[0xc] = '\0';
      writer_id[0xd] = '\0';
      writer_id[0xe] = '\0';
      writer_id[0xf] = '\0';
      writer_id[0x10] = '\0';
      writer_id[0x11] = '\0';
      writer_id[0x12] = '\0';
      writer_id[0x13] = '\0';
      writer_id._0_2_ = *(undefined2 *)&(this_02->m_backend).m_output.m_num_endpoints;
      writer_id._2_2_ = *(undefined2 *)&(this_02->m_backend).m_output.m_num_selectors;
      packed_uint<4U>::operator=
                ((packed_uint<4U> *)(writer_id + 4),
                 (ulong)(this_02->m_backend).m_output.m_endpoint_palette.m_size);
      packed_uint<4U>::operator=
                ((packed_uint<4U> *)(writer_id + 8),
                 (ulong)(this_02->m_backend).m_output.m_selector_palette.m_size);
      packed_uint<4U>::operator=
                ((packed_uint<4U> *)(writer_id + 0xc),
                 (ulong)(this_02->m_backend).m_output.m_slice_image_tables.m_size);
      vector<basist::ktx2_etc1s_image_desc>::vector
                ((vector<basist::ktx2_etc1s_image_desc> *)&key_values,
                 (ulong)(uVar16 * local_1d4 * uVar5));
      local_c0 = &(this_02->m_backend).m_output.m_endpoint_palette;
      local_c8 = &(this_02->m_backend).m_output.m_selector_palette;
      local_d0 = &(this_02->m_backend).m_output.m_slice_image_tables;
      memset(key_values.m_p,0,(ulong)(key_values.m_size * 0x14));
      for (uVar21 = 0; uVar21 < (this_02->m_slice_descs).m_size; uVar21 = uVar21 + 1) {
        pbVar6 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,uVar21);
        uVar3 = pbVar6->m_source_file_index;
        bVar1 = (this_02->m_params).m_tex_type;
        uVar14 = 0;
        uVar4 = uVar3;
        if (bVar1 == cBASISTexTypeCubemapArray) {
          uVar4 = uVar3 / 6;
          uVar14 = uVar3 % 6;
        }
        i_00 = (ulong)((pbVar6->m_mip_index * uVar16 + uVar4) * local_1d4 + uVar14);
        if (pbVar6->m_alpha == true) {
          pvVar7 = vector<basisu::vector<unsigned_char>_>::operator[](local_1e0,uVar21);
          lVar19 = 0x10;
          lStack_1f0 = 0xc;
        }
        else {
          if (bVar1 == cBASISTexTypeVideoFrames) {
            bVar22 = pbVar6->m_iframe;
            pkVar9 = vector<basist::ktx2_etc1s_image_desc>::operator[]
                               ((vector<basist::ktx2_etc1s_image_desc> *)&key_values,i_00);
            packed_uint<4U>::operator=(&pkVar9->m_image_flags,(ulong)((bVar22 ^ 1) * 2));
          }
          pvVar7 = vector<basisu::vector<unsigned_char>_>::operator[](local_1e0,uVar21);
          lVar19 = 8;
          lStack_1f0 = 4;
        }
        uVar3 = pvVar7->m_size;
        pkVar9 = vector<basist::ktx2_etc1s_image_desc>::operator[]
                           ((vector<basist::ktx2_etc1s_image_desc> *)&key_values,i_00);
        packed_uint<4U>::operator=
                  ((packed_uint<4U> *)((pkVar9->m_image_flags).m_bytes + lVar19),(ulong)uVar3);
        puVar8 = vector<unsigned_int>::operator[](&slice_level_offsets,uVar21);
        uVar3 = *puVar8;
        pkVar9 = vector<basist::ktx2_etc1s_image_desc>::operator[]
                           ((vector<basist::ktx2_etc1s_image_desc> *)&key_values,i_00);
        packed_uint<4U>::operator=
                  ((packed_uint<4U> *)((pkVar9->m_image_flags).m_bytes + lStack_1f0),(ulong)uVar3);
        this_02 = local_1d0;
      }
      append_vector<basisu::vector<unsigned_char>,unsigned_char>
                (&etc1s_global_data,(uchar *)writer_id,0x14);
      append_vector<basisu::vector<unsigned_char>,unsigned_char>
                (&etc1s_global_data,(uchar *)key_values.m_p,(ulong)(key_values.m_size * 0x14));
      append_vector<basisu::vector<unsigned_char>>(&etc1s_global_data,local_c0);
      append_vector<basisu::vector<unsigned_char>>(&etc1s_global_data,local_c8);
      append_vector<basisu::vector<unsigned_char>>(&etc1s_global_data,local_d0);
      packed_uint<4U>::operator=(&local_120.m_supercompression_scheme,1);
      free(key_values.m_p);
    }
    vector<basist::ktx2_transcoder::key_value>::vector
              (&key_values,&(this_02->m_params).m_ktx2_key_values);
    vector<basist::ktx2_transcoder::key_value>::enlarge(&key_values,1);
    pkVar10 = vector<basist::ktx2_transcoder::key_value>::back(&key_values);
    vector<unsigned_char>::resize(&pkVar10->m_key,10,false);
    pkVar10 = vector<basist::ktx2_transcoder::key_value>::back(&key_values);
    builtin_memcpy((pkVar10->m_key).m_p,"KTXwriter",10);
    snprintf(writer_id,0x80,"Basis Universal %s","1.16");
    pkVar10 = vector<basist::ktx2_transcoder::key_value>::back(&key_values);
    sVar11 = strlen(writer_id);
    new_size_size_t = sVar11 + 1;
    vector<unsigned_char>::resize(&pkVar10->m_value,new_size_size_t,false);
    pkVar10 = vector<basist::ktx2_transcoder::key_value>::back(&key_values);
    memcpy((pkVar10->m_value).m_p,writer_id,new_size_size_t);
    vector<basist::ktx2_transcoder::key_value>::sort(&key_values);
    key_value_data.m_p = (uchar *)0x0;
    key_value_data.m_size = 0;
    key_value_data.m_capacity = 0;
    dfd.m_p = (uchar *)0x0;
    dfd.m_size = 0;
    dfd.m_capacity = 0;
    get_dfd(this_02,&dfd,&local_120);
    local_1d4 = uVar5 * 0x18 + dfd.m_size + 0x50;
    pvVar7 = (vector<unsigned_char> *)CONCAT71((int7)(new_size_size_t >> 8),1);
    while( true ) {
      local_1e0 = (vector<basisu::vector<unsigned_char>_> *)pvVar7;
      for (uVar21 = 0; uVar16 = local_1d4, bVar22 = key_values.m_size <= uVar21, !bVar22;
          uVar21 = uVar21 + 1) {
        pkVar10 = vector<basist::ktx2_transcoder::key_value>::operator[](&key_values,uVar21);
        if ((pkVar10->m_key).m_size < 2) goto LAB_00216774;
        pkVar10 = vector<basist::ktx2_transcoder::key_value>::operator[](&key_values,uVar21);
        puVar12 = vector<unsigned_char>::back(&pkVar10->m_key);
        if (*puVar12 != '\0') goto LAB_00216774;
        pkVar10 = vector<basist::ktx2_transcoder::key_value>::operator[](&key_values,uVar21);
        uVar16 = (pkVar10->m_key).m_size;
        pkVar10 = vector<basist::ktx2_transcoder::key_value>::operator[](&key_values,uVar21);
        uVar17 = (ulong)(pkVar10->m_value).m_size + (ulong)uVar16;
        if (0xfffffffe < uVar17) goto LAB_00216774;
        packed_uint<4U>::operator=((packed_uint<4U> *)&level_index_array,uVar17);
        append_vector<basisu::vector<unsigned_char>,unsigned_char>
                  (&key_value_data,(uchar *)&level_index_array,4);
        pkVar10 = vector<basist::ktx2_transcoder::key_value>::operator[](&key_values,uVar21);
        append_vector<basisu::vector<unsigned_char>>(&key_value_data,&pkVar10->m_key);
        pkVar10 = vector<basist::ktx2_transcoder::key_value>::operator[](&key_values,uVar21);
        append_vector<basisu::vector<unsigned_char>>(&key_value_data,&pkVar10->m_value);
        uVar16 = -key_value_data.m_size & 3;
        while (bVar22 = uVar16 != 0, uVar16 = uVar16 - 1, bVar22) {
          local_1e1 = '\0';
          vector<unsigned_char>::push_back(&key_value_data,&local_1e1);
        }
      }
      if ((local_120.m_supercompression_scheme.m_bytes != (uint8_t  [4])0x0) ||
         (uVar5 = -(key_value_data.m_size + local_1d4) & 0xf, uVar5 == 0)) break;
      if (((ulong)local_1e0 & 1) == 0) {
        __assert_fail("!pass",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                      ,0x7f1,"bool basisu::basis_compressor::create_ktx2_file()");
      }
      uVar16 = uVar5 + 0x10;
      if (5 < uVar5) {
        uVar16 = uVar5;
      }
      printf("WARNING: Due to a KTX2 validator bug related to mipPadding, we must insert a dummy key into the KTX2 file of %u bytes\n"
             ,(ulong)uVar16);
      vector<basist::ktx2_transcoder::key_value>::enlarge(&key_values,1);
      iVar15 = uVar16 - 6;
      while( true ) {
        pkVar10 = vector<basist::ktx2_transcoder::key_value>::back(&key_values);
        bVar22 = iVar15 == 0;
        iVar15 = iVar15 + -1;
        if (bVar22) break;
        level_index_array.m_p._0_1_ = 0x7f;
        vector<unsigned_char>::push_back(&pkVar10->m_key,(uchar *)&level_index_array);
      }
      level_index_array.m_p._0_1_ = 0;
      vector<unsigned_char>::push_back(&pkVar10->m_key,(uchar *)&level_index_array);
      pkVar10 = vector<basist::ktx2_transcoder::key_value>::back(&key_values);
      level_index_array.m_p._0_1_ = 0;
      vector<unsigned_char>::push_back(&pkVar10->m_value,(uchar *)&level_index_array);
      vector<basist::ktx2_transcoder::key_value>::sort(&key_values);
      pvVar7 = (vector<unsigned_char> *)0x0;
      vector<unsigned_char>::resize(&key_value_data,0,false);
    }
    vector<basist::ktx2_level_index>::vector(&level_index_array,uVar18);
    memset((void *)CONCAT71(level_index_array.m_p._1_7_,level_index_array.m_p._0_1_),0,
           (ulong)(level_index_array.m_size * 0x18));
    pbVar2 = local_1d0;
    this_01 = &local_1d0->m_output_ktx2_file;
    vector<unsigned_char>::clear(this_01);
    vector<unsigned_char>::reserve(this_01,(ulong)(pbVar2->m_output_basis_file).m_size);
    vector<unsigned_char>::resize(this_01,0x50,false);
    append_vector<basisu::vector<unsigned_char>,unsigned_char>
              (this_01,(uchar *)CONCAT71(level_index_array.m_p._1_7_,level_index_array.m_p._0_1_),
               (ulong)(level_index_array.m_size * 0x18));
    puVar12 = dfd.m_p;
    pbVar2 = local_1d0;
    uVar21 = dfd._8_8_ & 0xffffffff;
    packed_uint<4U>::operator=
              (&local_120.m_dfd_byte_offset,(ulong)(local_1d0->m_output_ktx2_file).m_size);
    packed_uint<4U>::operator=(&local_120.m_dfd_byte_length,uVar21);
    local_1e0 = (vector<basisu::vector<unsigned_char>_> *)this_01;
    append_vector<basisu::vector<unsigned_char>,unsigned_char>(this_01,puVar12,uVar21);
    if (key_value_data.m_size != 0) {
      if (uVar16 != (pbVar2->m_output_ktx2_file).m_size) {
        __assert_fail("kvd_file_offset == m_output_ktx2_file.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                      ,0x822,"bool basisu::basis_compressor::create_ktx2_file()");
      }
      packed_uint<4U>::operator=(&local_120.m_kvd_byte_offset,(ulong)uVar16);
      packed_uint<4U>::operator=(&local_120.m_kvd_byte_length,key_value_data._8_8_ & 0xffffffff);
      append_vector<basisu::vector<unsigned_char>>
                ((vector<unsigned_char> *)local_1e0,&key_value_data);
    }
    vec = local_1e0;
    if (etc1s_global_data.m_size != 0) {
      uVar16 = -(pbVar2->m_output_ktx2_file).m_size & 7;
      while (bVar23 = uVar16 != 0, uVar16 = uVar16 - 1, bVar23) {
        local_1e1 = '\0';
        vector<unsigned_char>::push_back((vector<unsigned_char> *)vec,&local_1e1);
      }
      packed_uint<8U>::operator=(&local_120.m_sgd_byte_length,etc1s_global_data._8_8_ & 0xffffffff);
      packed_uint<8U>::operator=
                (&local_120.m_sgd_byte_offset,(ulong)(pbVar2->m_output_ktx2_file).m_size);
      append_vector<basisu::vector<unsigned_char>>((vector<unsigned_char> *)vec,&etc1s_global_data);
    }
    if (local_120.m_supercompression_scheme.m_bytes == (uint8_t  [4])0x0) {
      uVar16 = -(pbVar2->m_output_ktx2_file).m_size & 0xf;
      if (uVar16 != 0) {
        printf("Warning: KTX2 mip level data is not 16-byte aligned. This may trigger a ktx2check validation bug. Writing %u bytes of mipPadding.\n"
               ,(ulong)uVar16);
      }
      while (bVar23 = uVar16 != 0, uVar16 = uVar16 - 1, bVar23) {
        local_1e1 = '\0';
        vector<unsigned_char>::push_back((vector<unsigned_char> *)vec,&local_1e1);
      }
    }
    while( true ) {
      pbVar2 = local_1d0;
      uVar18 = uVar18 - 1;
      if ((int)(uint)uVar18 < 0) break;
      uVar21 = (ulong)((uint)uVar18 & 0x7fffffff);
      pvVar7 = vector<basisu::vector<unsigned_char>_>::operator[]
                         (&compressed_level_data_bytes,uVar21);
      uVar16 = pvVar7->m_size;
      pkVar13 = vector<basist::ktx2_level_index>::operator[](&level_index_array,uVar21);
      packed_uint<8U>::operator=(&pkVar13->m_byte_length,(ulong)uVar16);
      if ((local_1d0->m_params).m_uastc.m_value == true) {
        pvVar7 = vector<basisu::vector<unsigned_char>_>::operator[](&level_data_bytes,uVar21);
        uVar16 = pvVar7->m_size;
        pkVar13 = vector<basist::ktx2_level_index>::operator[](&level_index_array,uVar21);
        packed_uint<8U>::operator=(&pkVar13->m_uncompressed_byte_length,(ulong)uVar16);
      }
      uVar16 = (local_1d0->m_output_ktx2_file).m_size;
      pkVar13 = vector<basist::ktx2_level_index>::operator[](&level_index_array,uVar21);
      packed_uint<8U>::operator=(&pkVar13->m_byte_offset,(ulong)uVar16);
      pvVar7 = vector<basisu::vector<unsigned_char>_>::operator[]
                         (&compressed_level_data_bytes,uVar21);
      append_vector<basisu::vector<unsigned_char>>((vector<unsigned_char> *)local_1e0,pvVar7);
    }
    memcpy((local_1d0->m_output_ktx2_file).m_p,&local_120,0x50);
    memcpy((pbVar2->m_output_ktx2_file).m_p + 0x50,
           (void *)CONCAT71(level_index_array.m_p._1_7_,level_index_array.m_p._0_1_),
           (ulong)(level_index_array.m_size * 0x18));
    debug_printf("Total .ktx2 output file size: %u\n",(ulong)(pbVar2->m_output_ktx2_file).m_size);
    free((void *)CONCAT71(level_index_array.m_p._1_7_,level_index_array.m_p._0_1_));
LAB_00216774:
    free(dfd.m_p);
    free(key_value_data.m_p);
    vector<basist::ktx2_transcoder::key_value>::~vector(&key_values);
    free(etc1s_global_data.m_p);
    free(slice_level_offsets.m_p);
    vector<basisu::vector<unsigned_char>_>::~vector(&compressed_level_data_bytes);
    vector<basisu::vector<unsigned_char>_>::~vector(&level_data_bytes);
  }
  return bVar22;
}

Assistant:

bool basis_compressor::create_ktx2_file()
	{
		if (m_params.m_uastc)
		{
			if ((m_params.m_ktx2_uastc_supercompression != basist::KTX2_SS_NONE) && (m_params.m_ktx2_uastc_supercompression != basist::KTX2_SS_ZSTANDARD))
				return false;
		}

		const basisu_backend_output& backend_output = m_backend.get_output();

		// Determine the width/height, number of array layers, mipmap levels, and the number of faces (1 for 2D, 6 for cubemap).
		// This does not support 1D or 3D.
		uint32_t base_width = 0, base_height = 0, total_layers = 0, total_levels = 0, total_faces = 1;
				
		for (uint32_t i = 0; i < m_slice_descs.size(); i++)
		{
			if ((m_slice_descs[i].m_mip_index == 0) && (!base_width))
			{
				base_width = m_slice_descs[i].m_orig_width;
				base_height = m_slice_descs[i].m_orig_height;
			}

			total_layers = maximum<uint32_t>(total_layers, m_slice_descs[i].m_source_file_index + 1);

			if (!m_slice_descs[i].m_source_file_index)
				total_levels = maximum<uint32_t>(total_levels, m_slice_descs[i].m_mip_index + 1);
		}

		if (m_params.m_tex_type == basist::cBASISTexTypeCubemapArray)
		{
			assert((total_layers % 6) == 0);
			
			total_layers /= 6;
			assert(total_layers >= 1);

			total_faces = 6;
		}

		basist::ktx2_header header = {};
		memset((void*)&header, 0, sizeof(header));

		memcpy(header.m_identifier, basist::g_ktx2_file_identifier, sizeof(basist::g_ktx2_file_identifier));
		header.m_pixel_width = base_width;
		header.m_pixel_height = base_height;
		header.m_face_count = total_faces;
		header.m_vk_format = basist::KTX2_VK_FORMAT_UNDEFINED;
		header.m_type_size = 1;
		header.m_level_count = total_levels;
		header.m_layer_count = (total_layers > 1) ? total_layers : 0;

		if (m_params.m_uastc)
		{
			switch (m_params.m_ktx2_uastc_supercompression)
			{
			case basist::KTX2_SS_NONE:
			{
				header.m_supercompression_scheme = basist::KTX2_SS_NONE;
				break;
			}
			case basist::KTX2_SS_ZSTANDARD:
			{
#if BASISD_SUPPORT_KTX2_ZSTD
				header.m_supercompression_scheme = basist::KTX2_SS_ZSTANDARD;
#else
				header.m_supercompression_scheme = basist::KTX2_SS_NONE;
#endif
				break;
			}
			default: assert(0); return false;
			}
		}

		basisu::vector<uint8_vec> level_data_bytes(total_levels);
		basisu::vector<uint8_vec> compressed_level_data_bytes(total_levels);
		uint_vec slice_level_offsets(m_slice_descs.size());

		// This will append the texture data in the correct order (for each level: layer, then face).
		for (uint32_t slice_index = 0; slice_index < m_slice_descs.size(); slice_index++)
		{
			const basisu_backend_slice_desc& slice_desc = m_slice_descs[slice_index];

			slice_level_offsets[slice_index] = level_data_bytes[slice_desc.m_mip_index].size();

			if (m_params.m_uastc)
				append_vector(level_data_bytes[slice_desc.m_mip_index], m_uastc_backend_output.m_slice_image_data[slice_index]);
			else
				append_vector(level_data_bytes[slice_desc.m_mip_index], backend_output.m_slice_image_data[slice_index]);
		}

		// UASTC supercompression
		if ((m_params.m_uastc) && (header.m_supercompression_scheme == basist::KTX2_SS_ZSTANDARD))
		{
#if BASISD_SUPPORT_KTX2_ZSTD
			for (uint32_t level_index = 0; level_index < total_levels; level_index++)
			{
				compressed_level_data_bytes[level_index].resize(ZSTD_compressBound(level_data_bytes[level_index].size()));

				size_t result = ZSTD_compress(compressed_level_data_bytes[level_index].data(), compressed_level_data_bytes[level_index].size(),
					level_data_bytes[level_index].data(), level_data_bytes[level_index].size(),
					m_params.m_ktx2_zstd_supercompression_level);

				if (ZSTD_isError(result))
					return false;

				compressed_level_data_bytes[level_index].resize(result);
			}
#else
			// Can't get here
			assert(0);
			return false;
#endif
		}
		else
		{
			// No supercompression
			compressed_level_data_bytes = level_data_bytes;
		}
				
		uint8_vec etc1s_global_data;

		// Create ETC1S global supercompressed data
		if (!m_params.m_uastc)
		{
			basist::ktx2_etc1s_global_data_header etc1s_global_data_header;
			clear_obj(etc1s_global_data_header);

			etc1s_global_data_header.m_endpoint_count = backend_output.m_num_endpoints;
			etc1s_global_data_header.m_selector_count = backend_output.m_num_selectors;
			etc1s_global_data_header.m_endpoints_byte_length = backend_output.m_endpoint_palette.size();
			etc1s_global_data_header.m_selectors_byte_length = backend_output.m_selector_palette.size();
			etc1s_global_data_header.m_tables_byte_length = backend_output.m_slice_image_tables.size();

			basisu::vector<basist::ktx2_etc1s_image_desc> etc1s_image_descs(total_levels * total_layers * total_faces);
			memset((void*)etc1s_image_descs.data(), 0, etc1s_image_descs.size_in_bytes());

			for (uint32_t slice_index = 0; slice_index < m_slice_descs.size(); slice_index++)
			{
				const basisu_backend_slice_desc& slice_desc = m_slice_descs[slice_index];

				const uint32_t level_index = slice_desc.m_mip_index;
				uint32_t layer_index = slice_desc.m_source_file_index;
				uint32_t face_index = 0;

				if (m_params.m_tex_type == basist::cBASISTexTypeCubemapArray)
				{
					face_index = layer_index % 6;
					layer_index /= 6;
				}

				const uint32_t etc1s_image_index = level_index * (total_layers * total_faces) + layer_index * total_faces + face_index;

				if (slice_desc.m_alpha)
				{
					etc1s_image_descs[etc1s_image_index].m_alpha_slice_byte_length = backend_output.m_slice_image_data[slice_index].size();
					etc1s_image_descs[etc1s_image_index].m_alpha_slice_byte_offset = slice_level_offsets[slice_index];
				}
				else
				{
					if (m_params.m_tex_type == basist::cBASISTexTypeVideoFrames)
						etc1s_image_descs[etc1s_image_index].m_image_flags = !slice_desc.m_iframe ? basist::KTX2_IMAGE_IS_P_FRAME : 0;

					etc1s_image_descs[etc1s_image_index].m_rgb_slice_byte_length = backend_output.m_slice_image_data[slice_index].size();
					etc1s_image_descs[etc1s_image_index].m_rgb_slice_byte_offset = slice_level_offsets[slice_index];
				}
			} // slice_index

			append_vector(etc1s_global_data, (const uint8_t*)&etc1s_global_data_header, sizeof(etc1s_global_data_header));
			append_vector(etc1s_global_data, (const uint8_t*)etc1s_image_descs.data(), etc1s_image_descs.size_in_bytes());
			append_vector(etc1s_global_data, backend_output.m_endpoint_palette);
			append_vector(etc1s_global_data, backend_output.m_selector_palette);
			append_vector(etc1s_global_data, backend_output.m_slice_image_tables);
			
			header.m_supercompression_scheme = basist::KTX2_SS_BASISLZ;
		}

		// Key values
		basist::ktx2_transcoder::key_value_vec key_values(m_params.m_ktx2_key_values);
		key_values.enlarge(1);
		
		const char* pKTXwriter = "KTXwriter";
		key_values.back().m_key.resize(strlen(pKTXwriter) + 1);
		memcpy(key_values.back().m_key.data(), pKTXwriter, strlen(pKTXwriter) + 1);

		char writer_id[128];
#ifdef _MSC_VER
		sprintf_s(writer_id, sizeof(writer_id), "Basis Universal %s", BASISU_LIB_VERSION_STRING);
#else
		snprintf(writer_id, sizeof(writer_id), "Basis Universal %s", BASISU_LIB_VERSION_STRING);
#endif
		key_values.back().m_value.resize(strlen(writer_id) + 1);
		memcpy(key_values.back().m_value.data(), writer_id, strlen(writer_id) + 1);

		key_values.sort();

#if BASISU_DISABLE_KTX2_KEY_VALUES
		// HACK HACK - Clear the key values array, which causes no key values to be written (triggering the ktx2check validator bug).
		key_values.clear();
#endif

		uint8_vec key_value_data;

		// DFD
		uint8_vec dfd;
		get_dfd(dfd, header);

		const uint32_t kvd_file_offset = sizeof(header) + sizeof(basist::ktx2_level_index) * total_levels + dfd.size();

		for (uint32_t pass = 0; pass < 2; pass++)
		{
			for (uint32_t i = 0; i < key_values.size(); i++)
			{
				if (key_values[i].m_key.size() < 2)
					return false;

				if (key_values[i].m_key.back() != 0)
					return false;

				const uint64_t total_len = (uint64_t)key_values[i].m_key.size() + (uint64_t)key_values[i].m_value.size();
				if (total_len >= UINT32_MAX)
					return false;

				packed_uint<4> le_len((uint32_t)total_len);
				append_vector(key_value_data, (const uint8_t*)&le_len, sizeof(le_len));

				append_vector(key_value_data, key_values[i].m_key);
				append_vector(key_value_data, key_values[i].m_value);

				const uint32_t ofs = key_value_data.size() & 3;
				const uint32_t padding = (4 - ofs) & 3;
				for (uint32_t p = 0; p < padding; p++)
					key_value_data.push_back(0);
			}

			if (header.m_supercompression_scheme != basist::KTX2_SS_NONE)
				break;

#if BASISU_DISABLE_KTX2_ALIGNMENT_WORKAROUND
			break;
#endif
			
			// Hack to ensure the KVD block ends on a 16 byte boundary, because we have no other official way of aligning the data.
			uint32_t kvd_end_file_offset = kvd_file_offset + key_value_data.size();
			uint32_t bytes_needed_to_pad = (16 - (kvd_end_file_offset & 15)) & 15;
			if (!bytes_needed_to_pad)
			{
				// We're good. No need to add a dummy key.
				break;
			}

			assert(!pass);
			if (pass)
				return false;

			if (bytes_needed_to_pad < 6)
				bytes_needed_to_pad += 16;

			printf("WARNING: Due to a KTX2 validator bug related to mipPadding, we must insert a dummy key into the KTX2 file of %u bytes\n", bytes_needed_to_pad);
			
			// We're not good - need to add a dummy key large enough to force file alignment so the mip level array gets aligned. 
			// We can't just add some bytes before the mip level array because ktx2check will see that as extra data in the file that shouldn't be there in ktxValidator::validateDataSize().
			key_values.enlarge(1);
			for (uint32_t i = 0; i < (bytes_needed_to_pad - 4 - 1 - 1); i++)
				key_values.back().m_key.push_back(127);
			
			key_values.back().m_key.push_back(0);

			key_values.back().m_value.push_back(0);

			key_values.sort();

			key_value_data.resize(0);
			
			// Try again
		}

		basisu::vector<basist::ktx2_level_index> level_index_array(total_levels);
		memset((void*)level_index_array.data(), 0, level_index_array.size_in_bytes());
				
		m_output_ktx2_file.clear();
		m_output_ktx2_file.reserve(m_output_basis_file.size());

		// Dummy header
		m_output_ktx2_file.resize(sizeof(header));

		// Level index array
		append_vector(m_output_ktx2_file, (const uint8_t*)level_index_array.data(), level_index_array.size_in_bytes());
				
		// DFD
		const uint8_t* pDFD = dfd.data();
		uint32_t dfd_len = dfd.size();

		header.m_dfd_byte_offset = m_output_ktx2_file.size();
		header.m_dfd_byte_length = dfd_len;
		append_vector(m_output_ktx2_file, pDFD, dfd_len);

		// Key value data
		if (key_value_data.size())
		{
			assert(kvd_file_offset == m_output_ktx2_file.size());

			header.m_kvd_byte_offset = m_output_ktx2_file.size();
			header.m_kvd_byte_length = key_value_data.size();
			append_vector(m_output_ktx2_file, key_value_data);
		}

		// Global Supercompressed Data
		if (etc1s_global_data.size())
		{
			uint32_t ofs = m_output_ktx2_file.size() & 7;
			uint32_t padding = (8 - ofs) & 7;
			for (uint32_t i = 0; i < padding; i++)
				m_output_ktx2_file.push_back(0);

			header.m_sgd_byte_length = etc1s_global_data.size();
			header.m_sgd_byte_offset = m_output_ktx2_file.size();

			append_vector(m_output_ktx2_file, etc1s_global_data);
		}

		// mipPadding
		if (header.m_supercompression_scheme == basist::KTX2_SS_NONE)
		{
			// We currently can't do this or the validator will incorrectly give an error.
			uint32_t ofs = m_output_ktx2_file.size() & 15;
			uint32_t padding = (16 - ofs) & 15;

			// Make sure we're always aligned here (due to a validator bug).
			if (padding)
			{
				printf("Warning: KTX2 mip level data is not 16-byte aligned. This may trigger a ktx2check validation bug. Writing %u bytes of mipPadding.\n", padding);
			}

			for (uint32_t i = 0; i < padding; i++)
				m_output_ktx2_file.push_back(0);
		}

		// Level data - write the smallest mipmap first.
		for (int level = total_levels - 1; level >= 0; level--)
		{
			level_index_array[level].m_byte_length = compressed_level_data_bytes[level].size();
			if (m_params.m_uastc)
				level_index_array[level].m_uncompressed_byte_length = level_data_bytes[level].size();

			level_index_array[level].m_byte_offset = m_output_ktx2_file.size();
			append_vector(m_output_ktx2_file, compressed_level_data_bytes[level]);
		}
		
		// Write final header
		memcpy(m_output_ktx2_file.data(), &header, sizeof(header));

		// Write final level index array
		memcpy(m_output_ktx2_file.data() + sizeof(header), level_index_array.data(), level_index_array.size_in_bytes());

		debug_printf("Total .ktx2 output file size: %u\n", m_output_ktx2_file.size());

		return true;
	}